

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckSemicolonSpace.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckSemicolonSpace(Parser *this,unsigned_long max)

{
  string *psVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  unsigned_long space;
  ulong uVar7;
  allocator local_e1;
  undefined8 local_e0;
  size_t local_d8;
  Error error;
  string local_90;
  string local_70;
  string local_50;
  
  this->m_TestsDone[7] = true;
  pcVar4 = (char *)operator_new__(0xff);
  local_e0 = 0;
  snprintf(pcVar4,0xff,"Semicolons = %ld max spaces",max);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 7));
  operator_delete__(pcVar4);
  psVar1 = &this->m_BufferNoComment;
  sVar5 = std::__cxx11::string::find((char *)psVar1,0x161d46);
  do {
    if (sVar5 == 0xffffffffffffffff) {
      uVar7 = std::__cxx11::string::find((char *)psVar1,0x161d46);
      do {
        if (uVar7 == 0xffffffffffffffff) {
          return (bool)(~(byte)local_e0 & 1);
        }
        while (uVar7 = uVar7 + 1, uVar7 < (this->m_BufferNoComment)._M_string_length) {
          cVar2 = (psVar1->_M_dataplus)._M_p[uVar7];
          if (((cVar2 != '\n') && (cVar2 != '\r')) && (cVar2 != ' ')) {
            if (cVar2 != ';') break;
            std::__cxx11::string::string((string *)&local_70,"",(allocator *)&error);
            bVar3 = IsBetweenCharsFast(this,'(',')',uVar7,false,&local_70);
            if (bVar3) {
              std::__cxx11::string::~string((string *)&local_70);
            }
            else {
              std::__cxx11::string::string((string *)&local_90,"",&local_e1);
              bVar3 = IsBetweenQuote(this,uVar7,false,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              if (!bVar3) {
                error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
                error.description._M_string_length = 0;
                error.description.field_2._M_local_buf[0] = '\0';
                error.line = GetLineNumber(this,uVar7,true);
                error.number = 7;
                error.line2 = error.line;
                std::__cxx11::string::assign((char *)&error.description);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,&error);
                if (this->m_FixFile == true) {
                  sVar5 = GetPositionWithComments(this,uVar7);
                  ReplaceCharInFixedBuffer(this,sVar5,1,"");
                }
                uVar6 = std::__cxx11::string::~string((string *)&error.description);
                local_e0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
              }
            }
          }
        }
        uVar7 = std::__cxx11::string::find((char *)psVar1,0x161d46);
      } while( true );
    }
    uVar7 = 0;
    local_d8 = sVar5;
    while (0 < (long)sVar5) {
      cVar2 = (psVar1->_M_dataplus)._M_p[sVar5 - 1];
      if (cVar2 != ' ') {
        if ((cVar2 != '\n') && (max < uVar7)) {
          error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
          error.description._M_string_length = 0;
          error.description.field_2._M_local_buf[0] = '\0';
          error.line = GetLineNumber(this,local_d8,true);
          error.number = 7;
          error.line2 = error.line;
          std::__cxx11::string::assign((char *)&error.description);
          pcVar4 = (char *)operator_new__(10);
          snprintf(pcVar4,10,"%ld",uVar7);
          std::__cxx11::string::append((char *)&error.description);
          std::__cxx11::string::append((char *)&error.description);
          operator_delete__(pcVar4);
          pcVar4 = (char *)operator_new__(10);
          snprintf(pcVar4,10,"%ld",max);
          std::__cxx11::string::append((char *)&error.description);
          std::__cxx11::string::append((char *)&error.description);
          operator_delete__(pcVar4);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,&error);
          if (this->m_FixFile == true) {
            sVar5 = GetPositionWithComments(this,local_d8 - uVar7);
            ReplaceCharInFixedBuffer(this,sVar5,uVar7,"");
          }
          uVar6 = std::__cxx11::string::~string((string *)&error.description);
          local_e0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
        }
        break;
      }
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&error);
      sVar5 = sVar5 - 1;
      bVar3 = IsBetweenQuote(this,sVar5,false,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar7 = uVar7 + !bVar3;
    }
    sVar5 = std::__cxx11::string::find((char *)psVar1,0x161d46);
  } while( true );
}

Assistant:

bool Parser::CheckSemicolonSpace(unsigned long max)
{
  m_TestsDone[SEMICOLON_SPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Semicolons = %ld max spaces",max);
  m_TestsDescription[SEMICOLON_SPACE] = val;
  delete [] val;

  bool hasError = false;
  auto posSemicolon = static_cast<long int>(m_BufferNoComment.find(";", 0));
  while(posSemicolon != -1)
    {
    // We try to find the word before that
    long i=posSemicolon-1;
    unsigned long space = 0;
    while(i>=0)
      {
       if(m_BufferNoComment[i] == ' ')
        {
        if(!IsBetweenQuote(i))
          {
          space++;
          }
        }
       else
        {
        if(m_BufferNoComment[i] != '\n' && space > max)
          {
          Error error;
          error.line = this->GetLineNumber(posSemicolon,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Number of spaces before semicolon exceed: ";
          constexpr size_t length = 10;
          char* localval = new char[length];
          snprintf(localval,length,"%ld",space);
          error.description += localval;
          error.description += " (max=";
          delete [] localval;
          localval = new char[length];
          snprintf(localval,length,"%ld",max);
          error.description += localval;
          error.description += ")";
          delete [] localval;
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(posSemicolon-space),space,"");
            }
          } // space > max
        break;
        }
      i--;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",posSemicolon+1));
    }

  // We also check if we have two or more semicolons following each other
  posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",0));
  while(posSemicolon != -1)
    {
    // We look forward
    unsigned long i=posSemicolon+1;
    while(i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == ' ' || m_BufferNoComment[i] == '\r' || m_BufferNoComment[i] == '\n')
        {
        // this is normal
        }
      else if(m_BufferNoComment[i] == ';')
        {
        // if we have for ( ;; ) we don't report
        // or ";;"
        if(!this->IsBetweenCharsFast('(',')',i)
           && !this->IsBetweenQuote(i))
          {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Too many semicolons";
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(i),1,"");
            }
          }
        }
      else
        {
        break;
        }
      i++;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",i+1));
    }

  return !hasError;
}